

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSD.cpp
# Opt level: O1

void findMatch(vector<Descriptor,_std::allocator<Descriptor>_> *keyPointDescriptor1,
              vector<Descriptor,_std::allocator<Descriptor>_> *keyPointDescriptor2,
              vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keyPoint1,
              vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keyPoint2,
              vector<cv::DMatch,_std::allocator<cv::DMatch>_> *dMatch,int threshold)

{
  pointer *ppDVar1;
  pointer pDVar2;
  pointer pDVar3;
  iterator __position;
  float fVar4;
  pointer pDVar5;
  pointer pDVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Descriptor desp2;
  Descriptor desp1;
  float local_16c;
  float local_164;
  int local_160;
  int local_15c;
  undefined1 *local_148;
  undefined1 local_110 [8];
  undefined8 uStack_108;
  undefined8 uStack_100;
  int local_f8;
  undefined8 local_a0;
  undefined1 local_98;
  Mat local_90 [96];
  
  pDVar5 = (keyPointDescriptor1->super__Vector_base<Descriptor,_std::allocator<Descriptor>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pDVar2 = (keyPointDescriptor1->super__Vector_base<Descriptor,_std::allocator<Descriptor>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pDVar5 != pDVar2) {
    fVar4 = 0.0;
    do {
      local_98 = pDVar5->isPaired;
      local_a0._0_4_ = pDVar5->x;
      local_a0._4_4_ = pDVar5->y;
      cv::Mat::Mat(local_90,&pDVar5->v);
      pDVar6 = (keyPointDescriptor2->super__Vector_base<Descriptor,_std::allocator<Descriptor>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pDVar3 = (keyPointDescriptor2->super__Vector_base<Descriptor,_std::allocator<Descriptor>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (pDVar6 == pDVar3) {
        fVar9 = 0.0;
        fVar10 = 0.0;
        fVar7 = 0.0;
        fVar8 = 0.0;
        local_148 = (undefined1 *)0x0;
        local_16c = 3.4028235e+38;
        local_164 = 3.4028235e+38;
      }
      else {
        local_148 = (undefined1 *)0x0;
        local_164 = 3.4028235e+38;
        local_16c = 3.4028235e+38;
        local_15c = 0;
        local_160 = 0;
        fVar10 = 0.0;
        fVar9 = 0.0;
        do {
          uStack_108._0_1_ = pDVar6->isPaired;
          local_110._0_4_ = pDVar6->x;
          local_110._4_4_ = pDVar6->y;
          cv::Mat::Mat((Mat *)&uStack_100,&pDVar6->v);
          fVar7 = local_16c;
          if ((char)uStack_108 == '\0') {
            fVar8 = getDistance(local_90,(Mat *)&uStack_100);
            if (local_16c <= fVar8) {
              if (local_164 <= fVar8) goto LAB_00107860;
            }
            else {
              local_160 = (int)local_a0;
              local_15c = local_a0._4_4_;
              local_148 = local_110;
              fVar9 = (float)local_110._0_4_;
              fVar10 = (float)local_110._4_4_;
              fVar7 = fVar8;
              fVar8 = local_16c;
            }
          }
          else {
LAB_00107860:
            fVar8 = local_164;
          }
          local_164 = fVar8;
          local_16c = fVar7;
          cv::Mat::~Mat((Mat *)&uStack_100);
          pDVar6 = pDVar6 + 1;
        } while (pDVar6 != pDVar3);
        fVar7 = (float)local_160;
        fVar8 = (float)local_15c;
        fVar9 = (float)(int)fVar9;
        fVar10 = (float)(int)fVar10;
      }
      if ((local_16c <= (float)threshold) && (local_16c / local_164 <= 0.8)) {
        local_110._4_4_ = fVar8;
        local_110._0_4_ = fVar7;
        uStack_108._0_4_ = 5.0;
        uStack_108._4_4_ = -1.0;
        uStack_100._0_4_ = 0.0;
        uStack_100._4_4_ = 0;
        local_f8 = -1;
        std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::emplace_back<cv::KeyPoint>
                  (keyPoint1,(KeyPoint *)local_110);
        local_110._4_4_ = fVar10;
        local_110._0_4_ = fVar9;
        uStack_108._0_4_ = 5.0;
        uStack_108._4_4_ = -1.0;
        uStack_100._0_4_ = 0.0;
        uStack_100._4_4_ = 0;
        local_f8 = -1;
        std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::emplace_back<cv::KeyPoint>
                  (keyPoint2,(KeyPoint *)local_110);
        local_110._4_4_ = fVar4;
        local_110._0_4_ = fVar4;
        uStack_108._0_4_ = -NAN;
        uStack_108._4_4_ = 3.0;
        __position._M_current =
             (dMatch->super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (dMatch->super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>::_M_realloc_insert<cv::DMatch>
                    (dMatch,__position,(DMatch *)local_110);
        }
        else {
          (__position._M_current)->queryIdx = (int)fVar4;
          (__position._M_current)->trainIdx = (int)fVar4;
          (__position._M_current)->imgIdx = -1;
          (__position._M_current)->distance = 3.0;
          ppDVar1 = &(dMatch->super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppDVar1 = *ppDVar1 + 1;
        }
        fVar4 = (float)((int)fVar4 + 1);
        local_148[8] = 1;
      }
      cv::Mat::~Mat(local_90);
      pDVar5 = pDVar5 + 1;
    } while (pDVar5 != pDVar2);
  }
  return;
}

Assistant:

void findMatch(vector<Descriptor>& keyPointDescriptor1, vector<Descriptor>& keyPointDescriptor2, vector<KeyPoint>& keyPoint1, vector<KeyPoint>& keyPoint2, vector<DMatch>& dMatch, int threshold) {
	int idx = 0;
	for (Descriptor desp1 : keyPointDescriptor1) {
		Point bestPoint1;
		Point bestPoint2;
		Descriptor* bestDesp2=NULL;
		float bestDist = numeric_limits<float>::max();
		Point secondPoint1;
		Point secondPoint2;
		float secondDist = bestDist;
		for (Descriptor desp2 : keyPointDescriptor2) {
			//skip the keypoint if it has already been paired
			if (desp2.isPaired) continue;

			float dist = getDistance(desp1.v, desp2.v);
			if (dist < bestDist) {
				secondDist = bestDist;
				secondPoint1 = bestPoint1;
				secondPoint2 = bestPoint2;
				bestDist = dist;
				bestPoint1 = Point(desp1.x, desp1.y);
				bestPoint2 = Point(desp2.x, desp2.y);
				bestDesp2 = &desp2;
			}
			else if (dist < secondDist) {
				secondDist = dist;
				secondPoint1 = Point(desp1.x, desp1.y);
				secondPoint2 = Point(desp2.x, desp2.y);
			}
		}
		if (bestDist > threshold) continue;
		float ratio = bestDist / secondDist;
		if (ratio <= 0.8) {
			keyPoint1.push_back(KeyPoint(bestPoint1, 5));
			keyPoint2.push_back(KeyPoint(bestPoint2, 5));
			dMatch.push_back(DMatch(idx, idx, 3));
			++idx;
			(*bestDesp2).isPaired = true;
		}
	}
}